

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2LDRDPreInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint32_t RegNo_01;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  DecodeStatus DVar6;
  _Bool writeback;
  uint P;
  uint U;
  uint W;
  uint addr;
  uint Rn;
  uint Rt2;
  uint Rt;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  Rt2 = 3;
  _Rt = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  RegNo = fieldFromInstruction_4(Insn,0xc,4);
  RegNo_00 = fieldFromInstruction_4(Address_local._4_4_,8,4);
  RegNo_01 = fieldFromInstruction_4(Address_local._4_4_,0x10,4);
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,0,8);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0x15,1);
  uVar4 = fieldFromInstruction_4(Address_local._4_4_,0x17,1);
  uVar5 = fieldFromInstruction_4(Address_local._4_4_,0x18,1);
  if ((uVar3 == 1 || uVar5 == 0) && ((RegNo_01 == RegNo || (RegNo_01 == RegNo_00)))) {
    Check(&Rt2,MCDisassembler_SoftFail);
  }
  if (RegNo == RegNo_00) {
    Check(&Rt2,MCDisassembler_SoftFail);
  }
  DVar6 = DecoderGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rt);
  _Var1 = Check(&Rt2,DVar6);
  if (_Var1) {
    DVar6 = DecoderGPRRegisterClass(pMStack_18,RegNo_00,(uint64_t)Decoder_local,_Rt);
    _Var1 = Check(&Rt2,DVar6);
    if (_Var1) {
      DVar6 = DecoderGPRRegisterClass(pMStack_18,RegNo_01,(uint64_t)Decoder_local,_Rt);
      _Var1 = Check(&Rt2,DVar6);
      if (_Var1) {
        DVar6 = DecodeT2AddrModeImm8s4
                          (pMStack_18,uVar4 << 8 | RegNo_01 << 9 | uVar2,(uint64_t)Decoder_local,_Rt
                          );
        _Var1 = Check(&Rt2,DVar6);
        if (_Var1) {
          Inst_local._4_4_ = Rt2;
        }
        else {
          Inst_local._4_4_ = MCDisassembler_Fail;
        }
      }
      else {
        Inst_local._4_4_ = MCDisassembler_Fail;
      }
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeT2LDRDPreInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rt2 = fieldFromInstruction_4(Insn, 8, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned addr = fieldFromInstruction_4(Insn, 0, 8);
	unsigned W = fieldFromInstruction_4(Insn, 21, 1);
	unsigned U = fieldFromInstruction_4(Insn, 23, 1);
	unsigned P = fieldFromInstruction_4(Insn, 24, 1);
	bool writeback = (W == 1) | (P == 0);

	addr |= (U << 8) | (Rn << 9);

	if (writeback && (Rn == Rt || Rn == Rt2))
		Check(&S, MCDisassembler_SoftFail);
	if (Rt == Rt2)
		Check(&S, MCDisassembler_SoftFail);

	// Rt
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	// Rt2
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rt2, Address, Decoder)))
		return MCDisassembler_Fail;
	// Writeback operand
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	// addr
	if (!Check(&S, DecodeT2AddrModeImm8s4(Inst, addr, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}